

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathOp.cpp
# Opt level: O0

void __thiscall MathOp::Hada_Mat::back(Hada_Mat *this)

{
  int iVar1;
  bool bVar2;
  long in_RDI;
  Mat *in_stack_ffffffffffffff78;
  Mat *in_stack_ffffffffffffff80;
  Mat *in_stack_ffffffffffffffb0;
  Mat *in_stack_ffffffffffffffb8;
  Mat *in_stack_ffffffffffffffc8;
  Mat *in_stack_ffffffffffffffd0;
  
  *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + 1;
  iVar1 = *(int *)(in_RDI + 0x10);
  if (iVar1 == 1) {
    bVar2 = NeuronMat::getIsBack(*(NeuronMat **)(in_RDI + 0x28));
    if (!bVar2) {
      in_stack_ffffffffffffff78 = NeuronMat::getGrad(*(NeuronMat **)(in_RDI + 0x20));
      NeuronMat::getForward(*(NeuronMat **)(in_RDI + 0x30));
      in_stack_ffffffffffffff80 = (Mat *)&stack0xffffffffffffffd0;
      Mat::dot(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      Mat::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      Mat::~Mat((Mat *)0x1234df);
    }
    bVar2 = NeuronMat::getIsBack(*(NeuronMat **)(in_RDI + 0x30));
    if (!bVar2) {
      NeuronMat::getGrad(*(NeuronMat **)(in_RDI + 0x20));
      NeuronMat::getForward(*(NeuronMat **)(in_RDI + 0x28));
      Mat::dot(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      Mat::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      Mat::~Mat((Mat *)0x12356a);
    }
  }
  else if (iVar1 == 2) {
    bVar2 = NeuronMat::getIsBack(*(NeuronMat **)(in_RDI + 0x28));
    if (!bVar2) {
      (**(code **)**(undefined8 **)(in_RDI + 0x50))();
    }
    bVar2 = NeuronMat::getIsBack(*(NeuronMat **)(in_RDI + 0x30));
    if (!bVar2) {
      (**(code **)**(undefined8 **)(in_RDI + 0x58))();
    }
    bVar2 = NeuronMat::getIsBack(*(NeuronMat **)(in_RDI + 0x28));
    if (((!bVar2) && (bVar2 = Op::forwardHasNext(*(Op **)(in_RDI + 0x50)), bVar2)) ||
       ((bVar2 = NeuronMat::getIsBack(*(NeuronMat **)(in_RDI + 0x30)), !bVar2 &&
        (bVar2 = Op::forwardHasNext(*(Op **)(in_RDI + 0x58)), bVar2)))) {
      *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -1;
    }
  }
  else if (iVar1 == 3) {
    NeuronMat::getGrad(*(NeuronMat **)(in_RDI + 0x28));
    Mat::operator+=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    NeuronMat::getGrad(*(NeuronMat **)(in_RDI + 0x30));
    Mat::operator+=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void MathOp::Hada_Mat::back() {
    backRound++;
    //cout<<"hada backing..."<<endl;
    switch (backRound) {
        case 1: {
           // cout<<"case 1"<<endl;
            if (!a->getIsBack()) {
           //     cout<<"a getGrad1"<<endl;
                *temp_a = (*res->getGrad()).dot(*b->getForward());
           //     cout<<"a getGrad2"<<endl;
            }
            if (!b->getIsBack()) {
          //      cout<<"b getGrad1"<<endl;
                *temp_b = (*res->getGrad()).dot(*a->getForward());
          //      cout<<"b getGrad2"<<endl;
            }
        }
            break;
        case 2:
          //  cout<<"case 2"<<endl;
            if (!a->getIsBack()) {
          //      cout<<"a div2mp1"<<endl;
                div2mP_b_a->forward();
         //       cout<<"a div2mp2"<<endl;
            }
            if (!b->getIsBack()) {
         //       cout<<"b div2mp1"<<endl;
                div2mP_b_b->forward();
          //      cout<<"b div2mp2"<<endl;
            }
            if ((!a->getIsBack() && div2mP_b_a->forwardHasNext()) ||
                (!b->getIsBack() && div2mP_b_b->forwardHasNext())) {
                backRound--;
            }
            break;
        case 3:
            *a->getGrad()+=*temp_a;
            *b->getGrad()+=*temp_b;
    }
   // cout<<"hada backed..."<<endl;
}